

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.cpp
# Opt level: O0

void Cmd_map(FCommandLine *argv,APlayerPawn *who,int key)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  CRecoverableError *error;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  if (netgame) {
    Printf("Use \x1c+changemap\x1c- instead. \x1c+Map\x1c- is for single-player only.\n");
    return;
  }
  iVar2 = FCommandLine::argc(argv);
  if (iVar2 < 2) {
    Printf("Usage: map <map name> [coop|dm]\n");
    return;
  }
  pcVar3 = FCommandLine::operator[](argv,1);
  bVar1 = P_CheckMapData(pcVar3);
  if (!bVar1) {
    pcVar3 = FCommandLine::operator[](argv,1);
    Printf("No map %s\n",pcVar3);
    return;
  }
  iVar2 = FCommandLine::argc(argv);
  if (2 < iVar2) {
    pcVar3 = FCommandLine::operator[](argv,2);
    iVar2 = strcasecmp(pcVar3,"coop");
    if (iVar2 == 0) {
      FIntCVar::operator=(&deathmatch,0);
      multiplayernext = true;
      goto LAB_004a4fea;
    }
  }
  iVar2 = FCommandLine::argc(argv);
  if (2 < iVar2) {
    pcVar3 = FCommandLine::operator[](argv,2);
    iVar2 = strcasecmp(pcVar3,"dm");
    if (iVar2 == 0) {
      FIntCVar::operator=(&deathmatch,1);
      multiplayernext = true;
    }
  }
LAB_004a4fea:
  pcVar3 = FCommandLine::operator[](argv,1);
  G_DeferedInitNew(pcVar3,-1);
  return;
}

Assistant:

CCMD (map)
{
	if (netgame)
	{
		Printf ("Use " TEXTCOLOR_BOLD "changemap" TEXTCOLOR_NORMAL " instead. " TEXTCOLOR_BOLD "Map"
				TEXTCOLOR_NORMAL " is for single-player only.\n");
		return;
	}
	if (argv.argc() > 1)
	{
		try
		{
			if (!P_CheckMapData(argv[1]))
			{
				Printf ("No map %s\n", argv[1]);
			}
			else
			{
				if (argv.argc() > 2 && stricmp(argv[2], "coop") == 0)
				{
					deathmatch = false;
					multiplayernext = true;
				}
				else if (argv.argc() > 2 && stricmp(argv[2], "dm") == 0)
				{
					deathmatch = true;
					multiplayernext = true;
				}
				G_DeferedInitNew (argv[1]);
			}
		}
		catch(CRecoverableError &error)
		{
			if (error.GetMessage())
				Printf("%s", error.GetMessage());
		}
	}
	else
	{
		Printf ("Usage: map <map name> [coop|dm]\n");
	}
}